

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O1

void __thiscall
aggreports::FillTVaR
          (aggreports *this,
          map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
          *tail,int summary_id,int sidx,double nextreturnperiod_value,OASIS_FLOAT tvar)

{
  pointer *ppTVar1;
  iterator __position;
  mapped_type *this_00;
  wheatkey wk;
  TVaR local_18;
  key_type local_8;
  
  local_8.summary_id = summary_id;
  local_8.sidx = sidx;
  this_00 = std::
            map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
            ::operator[](tail,&local_8);
  __position._M_current =
       (this_00->super__Vector_base<TVaR,_std::allocator<TVaR>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (this_00->super__Vector_base<TVaR,_std::allocator<TVaR>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    local_18.retperiod = nextreturnperiod_value;
    local_18.tvar = tvar;
    std::vector<TVaR,_std::allocator<TVaR>_>::_M_realloc_insert<TVaR>(this_00,__position,&local_18);
  }
  else {
    (__position._M_current)->retperiod = nextreturnperiod_value;
    *(ulong *)&(__position._M_current)->tvar = CONCAT44(local_18._12_4_,tvar);
    ppTVar1 = &(this_00->super__Vector_base<TVaR,_std::allocator<TVaR>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
  }
  return;
}

Assistant:

void aggreports::FillTVaR(std::map<wheatkey, std::vector<TVaR>> &tail,
			  const int summary_id, const int sidx,
			  const double nextreturnperiod_value,
			  const OASIS_FLOAT tvar) {

  wheatkey wk;
  wk.summary_id = summary_id;
  wk.sidx = sidx;
  tail[wk].push_back({nextreturnperiod_value, tvar});

}